

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3DefaultConstructor_Test::TestBody(VectorsTest_Int3DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Int3 zero;
  AssertHelper *in_stack_ffffffffffffff10;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  int iVar3;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffff38;
  Type type;
  Vector3<int> *this_02;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar5;
  AssertHelper *in_stack_ffffffffffffff70;
  AssertionResult local_68;
  uint local_54;
  undefined4 local_2c;
  AssertionResult local_28;
  Vector3<int> local_14;
  
  type = (Type)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  this_02 = &local_14;
  pica::Vector3<int>::Vector3(this_02);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             (int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
             (int *)in_stack_ffffffffffffff10);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d627d);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,type,
               (char *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),iVar3,
               in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff70,
               (Message *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x1d62da);
  }
  local_54 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6348);
  if (local_54 == 0) {
    this_01 = &local_68;
    testing::internal::EqHelper<false>::Compare<int,int>
              (&this_01->success_,in_stack_ffffffffffffff20,
               (int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),
               (int *)in_stack_ffffffffffffff10);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    uVar4 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      in_stack_ffffffffffffff20 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1d63fb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar4,in_stack_ffffffffffffff30),
                 (int)((ulong)this_01 >> 0x20),in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff70,
                 (Message *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
      testing::Message::~Message((Message *)0x1d644f);
    }
    local_54 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d64b7);
    if (local_54 == 0) {
      uVar5 = 0;
      this_00 = (AssertionResult *)&stack0xffffffffffffff70;
      testing::internal::EqHelper<false>::Compare<int,int>
                (&this_01->success_,in_stack_ffffffffffffff20,
                 (int *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18),(int *)this_00
                );
      iVar3 = (int)((ulong)this_01 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
      if (!bVar1) {
        testing::Message::Message((Message *)this_02);
        testing::AssertionResult::failure_message((AssertionResult *)0x1d655b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar4,in_stack_ffffffffffffff30),
                   iVar3,in_stack_ffffffffffffff20);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff70,(Message *)CONCAT44(uVar5,in_stack_ffffffffffffff68));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        testing::Message::~Message((Message *)0x1d65a7);
      }
      local_54 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d6609);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, Int3DefaultConstructor)
{
    Int3 zero;
    ASSERT_EQ(zero.x, 0);
    ASSERT_EQ(zero.y, 0);
    ASSERT_EQ(zero.z, 0);
}